

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O3

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  idx_t *__k;
  _Rb_tree_header *p_Var1;
  data_t dVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  _Base_ptr p_Var5;
  optional_ptr<duckdb::FileBuffer,_true> *poVar6;
  mapped_type *pmVar7;
  CSVBufferHandle *pCVar8;
  bool bVar9;
  _Base_ptr p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  undefined7 in_register_00000081;
  size_type *psVar14;
  ulong uVar15;
  string local_58;
  idx_t *local_38;
  
  if ((int)CONCAT71(in_register_00000081,reconstruct_line) == 0) {
LAB_017e7f41:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((this->begin).buffer_pos == (this->end).buffer_pos) {
    uVar12 = (this->begin).buffer_idx;
    uVar15 = (this->end).buffer_idx;
    if (uVar12 != uVar15) goto LAB_017e7f61;
    if ((this->begin).buffer_size == (this->end).buffer_size) goto LAB_017e7f41;
LAB_017e80e7:
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_string_length = 0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    p_Var10 = (buffer_handles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      p_Var1 = &(buffer_handles->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var10 + 1) >= uVar12) {
          p_Var5 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar12];
      } while (p_Var10 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= uVar12)) {
        pmVar7 = ::std::
                 map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                 ::operator[](buffer_handles,&(this->begin).buffer_idx);
        pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar7);
        poVar6 = &(pCVar8->handle).node;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar6);
        iVar4 = (this->begin).buffer_pos;
        dVar2 = poVar6->ptr->buffer[iVar4];
        bVar9 = dVar2 == '\r' || dVar2 == '\n';
        *first_char_nl = bVar9;
        uVar12 = bVar9 + iVar4;
        if (uVar12 < (this->end).buffer_pos) {
          do {
            ::std::__cxx11::string::push_back((char)&local_58);
            uVar12 = uVar12 + 1;
          } while (uVar12 < (this->end).buffer_pos);
        }
LAB_017e81b3:
        paVar11 = &local_58.field_2;
        psVar14 = &local_58._M_string_length;
        SanitizeError(&local_58);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar11) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_58._M_string_length;
        goto LAB_017e8127;
      }
    }
  }
  else {
    uVar12 = (this->begin).buffer_idx;
    uVar15 = (this->end).buffer_idx;
LAB_017e7f61:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    __k = &(this->begin).buffer_idx;
    if (uVar15 == uVar12) goto LAB_017e80e7;
    p_Var10 = (buffer_handles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      local_38 = &(this->end).buffer_idx;
      p_Var1 = &(buffer_handles->_M_t)._M_impl.super__Rb_tree_header;
      p_Var13 = &p_Var1->_M_header;
      p_Var5 = p_Var10;
      do {
        if (*(ulong *)(p_Var5 + 1) >= uVar12) {
          p_Var13 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar12];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var13 == p_Var1) ||
         (p_Var5 = &p_Var1->_M_header, uVar12 < *(ulong *)(p_Var13 + 1))) goto LAB_017e811c;
      do {
        if (*(ulong *)(p_Var10 + 1) >= uVar15) {
          p_Var5 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar15];
      } while (p_Var10 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 == p_Var1) || (uVar15 < *(ulong *)(p_Var5 + 1)))
      goto LAB_017e811c;
      pmVar7 = ::std::
               map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
               ::operator[](buffer_handles,__k);
      pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar7);
      poVar6 = &(pCVar8->handle).node;
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar6);
      pdVar3 = poVar6->ptr->buffer;
      pmVar7 = ::std::
               map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
               ::operator[](buffer_handles,__k);
      pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar7);
      uVar12 = pCVar8->actual_size;
      pmVar7 = ::std::
               map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
               ::operator[](buffer_handles,local_38);
      pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar7);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar8->handle).node);
      iVar4 = (this->begin).buffer_pos;
      dVar2 = pdVar3[iVar4];
      bVar9 = dVar2 == '\r' || dVar2 == '\n';
      *first_char_nl = bVar9;
      for (uVar15 = bVar9 + iVar4; uVar15 < uVar12; uVar15 = uVar15 + 1) {
        ::std::__cxx11::string::push_back((char)&local_58);
      }
      if ((this->end).buffer_pos != 0) {
        uVar12 = 0;
        do {
          ::std::__cxx11::string::push_back((char)&local_58);
          uVar12 = uVar12 + 1;
        } while (uVar12 < (this->end).buffer_pos);
      }
      goto LAB_017e81b3;
    }
  }
LAB_017e811c:
  paVar11 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
  psVar14 = &__return_storage_ptr__->_M_string_length;
LAB_017e8127:
  *psVar14 = 0;
  paVar11->_M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}